

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseVanillaLayer.cpp
# Opt level: O3

void __thiscall DenseVanillaLayer::DenseVanillaLayer(DenseVanillaLayer *this,LayerMeta *meta)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  LayerMeta local_50;
  
  local_50.alpha = meta->alpha;
  paVar2 = &local_50.name.field_2;
  local_50.name._M_dataplus._M_p = (meta->name)._M_dataplus._M_p;
  paVar1 = &(meta->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p == paVar1) {
    local_50.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.name.field_2._8_8_ = *(undefined8 *)((long)&(meta->name).field_2 + 8);
    local_50.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_50.name._M_string_length = (meta->name)._M_string_length;
  (meta->name)._M_dataplus._M_p = (pointer)paVar1;
  (meta->name)._M_string_length = 0;
  (meta->name).field_2._M_local_buf[0] = '\0';
  local_50.width = meta->width;
  local_50.zShift = meta->zShift;
  local_50.size = meta->size;
  local_50.neuronBuilder = meta->neuronBuilder;
  ILayer::ILayer(&this->super_ILayer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_50.name._M_dataplus._M_p,local_50.name.field_2._M_allocated_capacity + 1);
  }
  (this->super_ILayer)._vptr_ILayer = (_func_int **)&PTR__ILayer_00116c08;
  return;
}

Assistant:

DenseVanillaLayer::DenseVanillaLayer( LayerMeta meta ) : ILayer( std::move( meta )) { }